

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_configure(App *this)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  App *in_RDI;
  App_p *app;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_18;
  App *this_00;
  
  if (in_RDI->default_startup == enabled) {
    in_RDI->disabled_ = false;
  }
  else if (in_RDI->default_startup == disabled) {
    in_RDI->disabled_ = true;
  }
  this_00 = (App *)&in_RDI->subcommands_;
  local_18._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            (in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator*(&local_18);
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x16837f);
    if ((peVar2->has_automatic_name_ & 1U) != 0) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16838f
                );
      ::std::__cxx11::string::clear();
    }
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1683a5);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x1683c1);
      peVar2->fallthrough_ = false;
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x1683d2);
      peVar2->prefix_command_ = false;
    }
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1683e0);
    peVar2->parent_ = in_RDI;
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1683f6);
    _configure(this_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_configure() {
    if(default_startup == startup_mode::enabled) {
        disabled_ = false;
    } else if(default_startup == startup_mode::disabled) {
        disabled_ = true;
    }
    for(const App_p &app : subcommands_) {
        if(app->has_automatic_name_) {
            app->name_.clear();
        }
        if(app->name_.empty()) {
            app->fallthrough_ = false;  // make sure fallthrough_ is false to prevent infinite loop
            app->prefix_command_ = false;
        }
        // make sure the parent is set to be this object in preparation for parse
        app->parent_ = this;
        app->_configure();
    }
}